

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_fill(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int64_t iVar5;
  JSValueUnion JVar6;
  double dVar7;
  JSRefCountHeader *p_1;
  ulong uVar8;
  JSValue JVar9;
  JSValue JVar10;
  int final;
  int32_t v;
  undefined4 uStack_44;
  int local_3c;
  double local_38;
  
  iVar5 = this_val.tag;
  JVar6 = this_val.u;
  iVar1 = js_typed_array_get_length_internal(ctx,this_val);
  if (iVar1 < 0) {
    uVar8 = 0;
    uVar3 = 0;
    iVar5 = 6;
    goto LAB_0015bd45;
  }
  if (*(ushort *)((long)JVar6.ptr + 6) == 0x15) {
    JVar10 = *argv;
    if (0xfffffff4 < (uint)argv->tag) {
      *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
    }
    iVar2 = JS_ToUint8ClampFree(ctx,&v,JVar10);
    if (iVar2 == 0) {
      dVar7 = (double)(long)v;
      goto LAB_0015bca4;
    }
  }
  else if (*(ushort *)((long)JVar6.ptr + 6) < 0x1c) {
    iVar2 = JS_ToInt32(ctx,&v,*argv);
    if (iVar2 == 0) {
      dVar7 = (double)(ulong)(uint)v;
LAB_0015bca4:
      v = 0;
      final = iVar1;
      if ((argc < 2) ||
         ((local_3c = argc, local_38 = dVar7, iVar2 = JS_ToInt32Clamp(ctx,&v,argv[1],0,iVar1,iVar1),
          iVar2 == 0 &&
          (((dVar7 = local_38, local_3c == 2 || ((int)argv[2].tag == 3)) ||
           (JVar10.tag = argv[2].tag, JVar10.u.ptr = argv[2].u.ptr,
           iVar1 = JS_ToInt32Clamp(ctx,&final,JVar10,0,iVar1,iVar1), dVar7 = local_38, iVar1 == 0)))
          ))) {
        if (*(char *)(*(long *)(*(long *)(*(long *)((long)JVar6.ptr + 0x30) + 0x18) + 0x30) + 4) ==
            '\0') {
          switch("includes"[(ulong)*(ushort *)((long)JVar6.ptr + 6) + 1]) {
          case '\0':
            if (v < final) {
              memset((void *)((long)v + *(long *)((long)JVar6.ptr + 0x38)),SUB84(dVar7,0),
                     (long)(final - v));
            }
            break;
          case '\x01':
            for (lVar4 = (long)v; lVar4 < final; lVar4 = lVar4 + 1) {
              *(short *)(*(long *)((long)JVar6.ptr + 0x38) + lVar4 * 2) = SUB82(dVar7,0);
            }
            break;
          case '\x02':
            for (lVar4 = (long)v; lVar4 < final; lVar4 = lVar4 + 1) {
              *(int *)(*(long *)((long)JVar6.ptr + 0x38) + lVar4 * 4) = SUB84(dVar7,0);
            }
            break;
          case '\x03':
            for (lVar4 = (long)v; lVar4 < final; lVar4 = lVar4 + 1) {
              *(double *)(*(long *)((long)JVar6.ptr + 0x38) + lVar4 * 8) = dVar7;
            }
            break;
          default:
            abort();
          }
          if (0xfffffff4 < (uint)this_val.tag) {
            *(int *)JVar6.ptr = *JVar6.ptr + 1;
          }
          uVar3 = (ulong)JVar6.ptr & 0xffffffff00000000;
          uVar8 = (ulong)JVar6.ptr & 0xffffffff;
          goto LAB_0015bd45;
        }
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
      }
    }
  }
  else {
    iVar2 = JS_ToFloat64(ctx,(double *)&v,*argv);
    if (iVar2 == 0) {
      dVar7 = (double)CONCAT44(uStack_44,v);
      if (*(short *)((long)JVar6.ptr + 6) == 0x1c) {
        dVar7 = (double)(ulong)(uint)(float)(double)CONCAT44(uStack_44,v);
      }
      goto LAB_0015bca4;
    }
  }
  uVar8 = 0;
  uVar3 = 0;
  iVar5 = 6;
LAB_0015bd45:
  JVar9.tag = iVar5;
  JVar9.u.ptr = (void *)(uVar8 | uVar3);
  return JVar9;
}

Assistant:

static JSValue js_typed_array_fill(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    JSObject *p;
    int len, k, final, shift;
    uint64_t v64;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        return JS_EXCEPTION;
    p = JS_VALUE_GET_OBJ(this_val);

    if (p->class_id == JS_CLASS_UINT8C_ARRAY) {
        int32_t v;
        if (JS_ToUint8ClampFree(ctx, &v, JS_DupValue(ctx, argv[0])))
            return JS_EXCEPTION;
        v64 = v;
    } else if (p->class_id <= JS_CLASS_UINT32_ARRAY) {
        uint32_t v;
        if (JS_ToUint32(ctx, &v, argv[0]))
            return JS_EXCEPTION;
        v64 = v;
    } else
#ifdef CONFIG_BIGNUM
    if (p->class_id <= JS_CLASS_BIG_UINT64_ARRAY) {
        if (JS_ToBigInt64(ctx, (int64_t *)&v64, argv[0]))
            return JS_EXCEPTION;
    } else
#endif
    {
        double d;
        if (JS_ToFloat64(ctx, &d, argv[0]))
            return JS_EXCEPTION;
        if (p->class_id == JS_CLASS_FLOAT32_ARRAY) {
            union {
                float f;
                uint32_t u32;
            } u;
            u.f = d;
            v64 = u.u32;
        } else {
            JSFloat64Union u;
            u.d = d;
            v64 = u.u64;
        }
    }

    k = 0;
    if (argc > 1) {
        if (JS_ToInt32Clamp(ctx, &k, argv[1], 0, len, len))
            return JS_EXCEPTION;
    }

    final = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[2], 0, len, len))
            return JS_EXCEPTION;
    }

    if (typed_array_is_detached(ctx, p))
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    
    shift = typed_array_size_log2(p->class_id);
    switch(shift) {
    case 0:
        if (k < final) {
            memset(p->u.array.u.uint8_ptr + k, v64, final - k);
        }
        break;
    case 1:
        for(; k < final; k++) {
            p->u.array.u.uint16_ptr[k] = v64;
        }
        break;
    case 2:
        for(; k < final; k++) {
            p->u.array.u.uint32_ptr[k] = v64;
        }
        break;
    case 3:
        for(; k < final; k++) {
            p->u.array.u.uint64_ptr[k] = v64;
        }
        break;
    default:
        abort();
    }
    return JS_DupValue(ctx, this_val);
}